

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_draw_command * nk__draw_list_next(nk_draw_command *cmd,nk_buffer *buffer,nk_draw_list *canvas)

{
  nk_draw_command *pnVar1;
  nk_draw_command *end;
  nk_draw_list *canvas_local;
  nk_buffer *buffer_local;
  nk_draw_command *cmd_local;
  
  if (buffer == (nk_buffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x2456,
                  "const struct nk_draw_command *nk__draw_list_next(const struct nk_draw_command *, const struct nk_buffer *, const struct nk_draw_list *)"
                 );
  }
  if (canvas != (nk_draw_list *)0x0) {
    if (((cmd == (nk_draw_command *)0x0) || (buffer == (nk_buffer *)0x0)) ||
       (canvas == (nk_draw_list *)0x0)) {
      cmd_local = (nk_draw_command *)0x0;
    }
    else {
      pnVar1 = nk__draw_list_end(canvas,buffer);
      if (pnVar1 < cmd) {
        cmd_local = cmd + -1;
      }
      else {
        cmd_local = (nk_draw_command *)0x0;
      }
    }
    return cmd_local;
  }
  __assert_fail("canvas",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x2457,
                "const struct nk_draw_command *nk__draw_list_next(const struct nk_draw_command *, const struct nk_buffer *, const struct nk_draw_list *)"
               );
}

Assistant:

NK_API const struct nk_draw_command*
nk__draw_list_next(const struct nk_draw_command *cmd,
    const struct nk_buffer *buffer, const struct nk_draw_list *canvas)
{
    const struct nk_draw_command *end;
    NK_ASSERT(buffer);
    NK_ASSERT(canvas);
    if (!cmd || !buffer || !canvas)
        return 0;

    end = nk__draw_list_end(canvas, buffer);
    if (cmd <= end) return 0;
    return (cmd-1);
}